

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

ArchType __thiscall llvm::Triple::getArchTypeForLLVMName(Triple *this,StringRef Name)

{
  StringRef ArchName;
  bool bVar1;
  ArchType *pAVar2;
  StringLiteral local_24f0;
  StringLiteral local_24e0;
  StringLiteral local_24d0;
  StringLiteral local_24c0;
  StringLiteral local_24b0;
  StringLiteral local_24a0;
  StringLiteral local_2490;
  StringLiteral local_2480;
  StringLiteral local_2470;
  StringLiteral local_2460;
  StringLiteral local_2450;
  StringLiteral local_2440;
  StringLiteral local_2430;
  StringLiteral local_2420;
  StringLiteral local_2410;
  StringLiteral local_2400;
  StringLiteral local_23f0;
  StringLiteral local_23e0;
  StringLiteral local_23d0;
  StringLiteral local_23c0;
  StringLiteral local_23b0;
  StringLiteral local_23a0;
  StringLiteral local_2390;
  StringLiteral local_2380;
  StringLiteral local_2370;
  StringLiteral local_2360;
  StringLiteral local_2350;
  StringLiteral local_2340;
  StringLiteral local_2330;
  StringLiteral local_2320;
  StringLiteral local_2310;
  StringLiteral local_2300;
  StringLiteral local_22f0;
  StringLiteral local_22e0;
  StringLiteral local_22d0;
  StringLiteral local_22c0;
  StringLiteral local_22b0;
  StringLiteral local_22a0;
  StringLiteral local_2290;
  StringLiteral local_2280;
  StringLiteral local_2270;
  StringLiteral local_2260;
  StringLiteral local_2250;
  StringLiteral local_2240;
  StringLiteral local_2230;
  StringLiteral local_2220;
  StringLiteral local_2210;
  StringLiteral local_2200;
  StringLiteral local_21f0;
  StringLiteral local_21e0;
  StringLiteral local_21d0;
  Triple *local_21c0;
  char *local_21b8;
  Triple *local_21b0;
  char *local_21a8;
  Optional<llvm::Triple::ArchType> OStack_21a0;
  Triple *local_2198;
  char *local_2190;
  ArchType local_2184;
  Triple *pTStack_2180;
  ArchType BPFArch;
  StringRef Name_local;
  ArchType local_2134;
  Triple **local_2130;
  char *local_2128;
  char *local_2120;
  char *local_2118;
  char *local_2110;
  Triple *local_2108;
  char *local_2100;
  ArchType local_20f4;
  Triple **local_20f0;
  char *local_20e8;
  char *local_20e0;
  char *local_20d8;
  char *local_20d0;
  Triple *local_20c8;
  char *local_20c0;
  ArchType local_20b4;
  Triple **local_20b0;
  char *local_20a8;
  char *local_20a0;
  char *local_2098;
  char *local_2090;
  Triple *local_2088;
  char *local_2080;
  ArchType local_2074;
  Triple **local_2070;
  char *local_2068;
  char *local_2060;
  char *local_2058;
  char *local_2050;
  Triple *local_2048;
  char *local_2040;
  ArchType local_2034;
  Triple **local_2030;
  char *local_2028;
  char *local_2020;
  char *local_2018;
  char *local_2010;
  Triple *local_2008;
  char *local_2000;
  ArchType local_1ff4;
  Triple **local_1ff0;
  char *local_1fe8;
  char *local_1fe0;
  char *local_1fd8;
  char *local_1fd0;
  Triple *local_1fc8;
  char *local_1fc0;
  ArchType local_1fb4;
  Triple **local_1fb0;
  char *local_1fa8;
  char *local_1fa0;
  char *local_1f98;
  char *local_1f90;
  Triple *local_1f88;
  char *local_1f80;
  ArchType local_1f74;
  Triple **local_1f70;
  char *local_1f68;
  char *local_1f60;
  char *local_1f58;
  char *local_1f50;
  Triple *local_1f48;
  char *local_1f40;
  ArchType local_1f34;
  Triple **local_1f30;
  char *local_1f28;
  char *local_1f20;
  char *local_1f18;
  char *local_1f10;
  Triple *local_1f08;
  char *local_1f00;
  ArchType local_1ef4;
  Triple **local_1ef0;
  char *local_1ee8;
  char *local_1ee0;
  char *local_1ed8;
  char *local_1ed0;
  Triple *local_1ec8;
  char *local_1ec0;
  ArchType local_1eb4;
  Triple **local_1eb0;
  char *local_1ea8;
  char *local_1ea0;
  char *local_1e98;
  char *local_1e90;
  Triple *local_1e88;
  char *local_1e80;
  ArchType local_1e74;
  Triple **local_1e70;
  char *local_1e68;
  char *local_1e60;
  char *local_1e58;
  char *local_1e50;
  Triple *local_1e48;
  char *local_1e40;
  ArchType local_1e34;
  Triple **local_1e30;
  char *local_1e28;
  char *local_1e20;
  char *local_1e18;
  char *local_1e10;
  Triple *local_1e08;
  char *local_1e00;
  ArchType local_1df4;
  Triple **local_1df0;
  char *local_1de8;
  char *local_1de0;
  char *local_1dd8;
  char *local_1dd0;
  Triple *local_1dc8;
  char *local_1dc0;
  ArchType local_1db4;
  Triple **local_1db0;
  char *local_1da8;
  char *local_1da0;
  char *local_1d98;
  char *local_1d90;
  Triple *local_1d88;
  char *local_1d80;
  ArchType local_1d74;
  Triple **local_1d70;
  char *local_1d68;
  char *local_1d60;
  char *local_1d58;
  char *local_1d50;
  Triple *local_1d48;
  char *local_1d40;
  ArchType local_1d34;
  Triple **local_1d30;
  char *local_1d28;
  char *local_1d20;
  char *local_1d18;
  char *local_1d10;
  Triple *local_1d08;
  char *local_1d00;
  ArchType local_1cf4;
  Triple **local_1cf0;
  char *local_1ce8;
  char *local_1ce0;
  char *local_1cd8;
  char *local_1cd0;
  Triple *local_1cc8;
  char *local_1cc0;
  ArchType local_1cb4;
  Triple **local_1cb0;
  char *local_1ca8;
  char *local_1ca0;
  char *local_1c98;
  char *local_1c90;
  Triple *local_1c88;
  char *local_1c80;
  ArchType local_1c74;
  Triple **local_1c70;
  char *local_1c68;
  char *local_1c60;
  char *local_1c58;
  char *local_1c50;
  Triple *local_1c48;
  char *local_1c40;
  ArchType local_1c34;
  Triple **local_1c30;
  char *local_1c28;
  char *local_1c20;
  char *local_1c18;
  char *local_1c10;
  Triple *local_1c08;
  char *local_1c00;
  ArchType local_1bf4;
  Triple **local_1bf0;
  char *local_1be8;
  char *local_1be0;
  char *local_1bd8;
  char *local_1bd0;
  Triple *local_1bc8;
  char *local_1bc0;
  ArchType local_1bb4;
  Triple **local_1bb0;
  char *local_1ba8;
  char *local_1ba0;
  char *local_1b98;
  char *local_1b90;
  Triple *local_1b88;
  char *local_1b80;
  ArchType local_1b74;
  Triple **local_1b70;
  char *local_1b68;
  char *local_1b60;
  char *local_1b58;
  char *local_1b50;
  Triple *local_1b48;
  char *local_1b40;
  ArchType local_1b34;
  Triple **local_1b30;
  char *local_1b28;
  char *local_1b20;
  char *local_1b18;
  char *local_1b10;
  Triple *local_1b08;
  char *local_1b00;
  ArchType local_1af4;
  Triple **local_1af0;
  char *local_1ae8;
  char *local_1ae0;
  char *local_1ad8;
  char *local_1ad0;
  Triple *local_1ac8;
  char *local_1ac0;
  ArchType local_1ab4;
  Triple **local_1ab0;
  char *local_1aa8;
  char *local_1aa0;
  char *local_1a98;
  char *local_1a90;
  Triple *local_1a88;
  char *local_1a80;
  ArchType local_1a74;
  Triple **local_1a70;
  char *local_1a68;
  char *local_1a60;
  char *local_1a58;
  char *local_1a50;
  Triple *local_1a48;
  char *local_1a40;
  ArchType local_1a34;
  Triple **local_1a30;
  char *local_1a28;
  char *local_1a20;
  char *local_1a18;
  char *local_1a10;
  Triple *local_1a08;
  char *local_1a00;
  ArchType local_19f4;
  Triple **local_19f0;
  char *local_19e8;
  char *local_19e0;
  char *local_19d8;
  char *local_19d0;
  Triple *local_19c8;
  char *local_19c0;
  ArchType local_19b4;
  Triple **local_19b0;
  char *local_19a8;
  char *local_19a0;
  char *local_1998;
  char *local_1990;
  Triple *local_1988;
  char *local_1980;
  ArchType local_1974;
  Triple **local_1970;
  char *local_1968;
  char *local_1960;
  char *local_1958;
  char *local_1950;
  Triple *local_1948;
  char *local_1940;
  ArchType local_1934;
  Triple **local_1930;
  char *local_1928;
  char *local_1920;
  char *local_1918;
  char *local_1910;
  Triple *local_1908;
  char *local_1900;
  ArchType local_18f4;
  Triple **local_18f0;
  char *local_18e8;
  char *local_18e0;
  char *local_18d8;
  char *local_18d0;
  Triple *local_18c8;
  char *local_18c0;
  ArchType local_18b4;
  Triple **local_18b0;
  char *local_18a8;
  char *local_18a0;
  char *local_1898;
  char *local_1890;
  Triple *local_1888;
  char *local_1880;
  ArchType local_1874;
  Triple **local_1870;
  char *local_1868;
  char *local_1860;
  char *local_1858;
  char *local_1850;
  Triple *local_1848;
  char *local_1840;
  ArchType local_1834;
  Triple **local_1830;
  char *local_1828;
  char *local_1820;
  char *local_1818;
  char *local_1810;
  Triple *local_1808;
  char *local_1800;
  ArchType local_17f4;
  Triple **local_17f0;
  char *local_17e8;
  char *local_17e0;
  char *local_17d8;
  char *local_17d0;
  Triple *local_17c8;
  char *local_17c0;
  ArchType local_17b4;
  Triple **local_17b0;
  char *local_17a8;
  char *local_17a0;
  char *local_1798;
  char *local_1790;
  Triple *local_1788;
  char *local_1780;
  ArchType local_1774;
  Triple **local_1770;
  char *local_1768;
  char *local_1760;
  char *local_1758;
  char *local_1750;
  Triple *local_1748;
  char *local_1740;
  ArchType local_1734;
  Triple **local_1730;
  char *local_1728;
  char *local_1720;
  char *local_1718;
  char *local_1710;
  Triple *local_1708;
  char *local_1700;
  ArchType local_16f4;
  Triple **local_16f0;
  char *local_16e8;
  char *local_16e0;
  char *local_16d8;
  char *local_16d0;
  Triple *local_16c8;
  char *local_16c0;
  ArchType local_16b4;
  Triple **local_16b0;
  char *local_16a8;
  char *local_16a0;
  char *local_1698;
  char *local_1690;
  Triple *local_1688;
  char *local_1680;
  ArchType local_1674;
  Triple **local_1670;
  char *local_1668;
  char *local_1660;
  char *local_1658;
  char *local_1650;
  Triple *local_1648;
  char *local_1640;
  ArchType local_1634;
  Triple **local_1630;
  char *local_1628;
  char *local_1620;
  char *local_1618;
  char *local_1610;
  Triple *local_1608;
  char *local_1600;
  ArchType local_15f4;
  Triple **local_15f0;
  char *local_15e8;
  char *local_15e0;
  char *local_15d8;
  char *local_15d0;
  Triple *local_15c8;
  char *local_15c0;
  ArchType local_15b4;
  Triple **local_15b0;
  char *local_15a8;
  char *local_15a0;
  char *local_1598;
  char *local_1590;
  Triple *local_1588;
  char *local_1580;
  ArchType local_1574;
  Triple **local_1570;
  char *local_1568;
  char *local_1560;
  char *local_1558;
  char *local_1550;
  Triple *local_1548;
  char *local_1540;
  ArchType local_1534;
  Triple **local_1530;
  char *local_1528;
  char *local_1520;
  char *local_1518;
  char *local_1510;
  Triple *local_1508;
  char *local_1500;
  ArchType local_14f4;
  Triple **local_14f0;
  char *local_14e8;
  char *local_14e0;
  char *local_14d8;
  char *local_14d0;
  ArchType local_14c4;
  Triple **local_14c0;
  char *local_14b8;
  char *local_14b0;
  ArchType local_14a4;
  Triple **local_14a0;
  ArchType local_1494;
  Triple **local_1490;
  char *local_1488;
  char *local_1480;
  char *local_1478;
  char *local_1470;
  char *local_1468;
  char *local_1460;
  Triple *local_1458;
  char *local_1450;
  char *local_1448;
  char *local_1440;
  char *local_1438;
  char *local_1430;
  Triple *local_1428;
  char *local_1420;
  char *local_1418;
  char *local_1410;
  char *local_1408;
  char *local_1400;
  Triple *local_13f8;
  char *local_13f0;
  char *local_13e8;
  char *local_13e0;
  char *local_13d8;
  char *local_13d0;
  Triple *local_13c8;
  char *local_13c0;
  char *local_13b8;
  char *local_13b0;
  char *local_13a8;
  char *local_13a0;
  Triple *local_1398;
  char *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1378;
  char *local_1370;
  Triple *local_1368;
  char *local_1360;
  char *local_1358;
  char *local_1350;
  char *local_1348;
  char *local_1340;
  Triple *local_1338;
  char *local_1330;
  char *local_1328;
  char *local_1320;
  char *local_1318;
  char *local_1310;
  Triple *local_1308;
  char *local_1300;
  char *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12e0;
  Triple *local_12d8;
  char *local_12d0;
  char *local_12c8;
  char *local_12c0;
  char *local_12b8;
  char *local_12b0;
  Triple *local_12a8;
  char *local_12a0;
  char *local_1298;
  char *local_1290;
  char *local_1288;
  char *local_1280;
  Triple *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1260;
  char *local_1258;
  char *local_1250;
  Triple *local_1248;
  char *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  char *local_1220;
  Triple *local_1218;
  char *local_1210;
  char *local_1208;
  char *local_1200;
  char *local_11f8;
  char *local_11f0;
  Triple *local_11e8;
  char *local_11e0;
  char *local_11d8;
  char *local_11d0;
  char *local_11c8;
  char *local_11c0;
  Triple *local_11b8;
  char *local_11b0;
  char *local_11a8;
  char *local_11a0;
  char *local_1198;
  char *local_1190;
  Triple *local_1188;
  char *local_1180;
  char *local_1178;
  char *local_1170;
  char *local_1168;
  char *local_1160;
  Triple *local_1158;
  char *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  Triple *local_1128;
  char *local_1120;
  char *local_1118;
  char *local_1110;
  char *local_1108;
  char *local_1100;
  Triple *local_10f8;
  char *local_10f0;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  char *local_10d0;
  Triple *local_10c8;
  char *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  Triple *local_1098;
  char *local_1090;
  char *local_1088;
  char *local_1080;
  char *local_1078;
  char *local_1070;
  Triple *local_1068;
  char *local_1060;
  char *local_1058;
  char *local_1050;
  char *local_1048;
  char *local_1040;
  Triple *local_1038;
  char *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  Triple *local_1008;
  char *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  Triple *local_fd8;
  char *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_fb8;
  char *local_fb0;
  Triple *local_fa8;
  char *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  Triple *local_f78;
  char *local_f70;
  char *local_f68;
  char *local_f60;
  char *local_f58;
  char *local_f50;
  Triple *local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  Triple *local_f18;
  char *local_f10;
  char *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  Triple *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  Triple *local_eb8;
  char *local_eb0;
  char *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e90;
  Triple *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  Triple *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  Triple *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  Triple *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  Triple *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  Triple *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  Triple *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  Triple *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  Triple *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  Triple *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  Triple *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  Triple *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  Triple *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  Triple *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  Triple *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  Triple *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  Triple *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  Triple *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  Triple *local_b28;
  char *local_b20;
  Triple **local_b18;
  char *local_b10;
  char *local_b08;
  Triple **local_b00;
  char *local_af8;
  char *local_af0;
  Triple **local_ae8;
  char *local_ae0;
  char *local_ad8;
  Triple **local_ad0;
  char *local_ac8;
  char *local_ac0;
  Triple **local_ab8;
  char *local_ab0;
  char *local_aa8;
  Triple **local_aa0;
  char *local_a98;
  char *local_a90;
  Triple **local_a88;
  char *local_a80;
  char *local_a78;
  Triple **local_a70;
  char *local_a68;
  char *local_a60;
  Triple **local_a58;
  char *local_a50;
  char *local_a48;
  Triple **local_a40;
  char *local_a38;
  char *local_a30;
  Triple **local_a28;
  char *local_a20;
  char *local_a18;
  Triple **local_a10;
  char *local_a08;
  char *local_a00;
  Triple **local_9f8;
  char *local_9f0;
  char *local_9e8;
  Triple **local_9e0;
  char *local_9d8;
  char *local_9d0;
  Triple **local_9c8;
  char *local_9c0;
  char *local_9b8;
  Triple **local_9b0;
  char *local_9a8;
  char *local_9a0;
  Triple **local_998;
  char *local_990;
  char *local_988;
  Triple **local_980;
  char *local_978;
  char *local_970;
  Triple **local_968;
  char *local_960;
  char *local_958;
  Triple **local_950;
  char *local_948;
  char *local_940;
  Triple **local_938;
  char *local_930;
  char *local_928;
  Triple **local_920;
  char *local_918;
  char *local_910;
  Triple **local_908;
  char *local_900;
  char *local_8f8;
  Triple **local_8f0;
  char *local_8e8;
  char *local_8e0;
  Triple **local_8d8;
  char *local_8d0;
  char *local_8c8;
  Triple **local_8c0;
  char *local_8b8;
  char *local_8b0;
  Triple **local_8a8;
  char *local_8a0;
  char *local_898;
  Triple **local_890;
  char *local_888;
  char *local_880;
  Triple **local_878;
  char *local_870;
  char *local_868;
  Triple **local_860;
  char *local_858;
  char *local_850;
  Triple **local_848;
  char *local_840;
  char *local_838;
  Triple **local_830;
  char *local_828;
  char *local_820;
  Triple **local_818;
  char *local_810;
  char *local_808;
  Triple **local_800;
  char *local_7f8;
  char *local_7f0;
  Triple **local_7e8;
  char *local_7e0;
  char *local_7d8;
  Triple **local_7d0;
  char *local_7c8;
  char *local_7c0;
  Triple **local_7b8;
  char *local_7b0;
  char *local_7a8;
  Triple **local_7a0;
  char *local_798;
  char *local_790;
  Triple **local_788;
  char *local_780;
  char *local_778;
  Triple **local_770;
  char *local_768;
  char *local_760;
  Triple **local_758;
  char *local_750;
  char *local_748;
  Triple **local_740;
  char *local_738;
  char *local_730;
  Triple **local_728;
  char *local_720;
  char *local_718;
  Triple **local_710;
  char *local_708;
  char *local_700;
  Triple **local_6f8;
  char *local_6f0;
  char *local_6e8;
  Triple **local_6e0;
  char *local_6d8;
  char *local_6d0;
  Triple **local_6c8;
  char *local_6c0;
  char *local_6b8;
  Triple **local_6b0;
  char *local_6a8;
  char *local_6a0;
  Triple **local_698;
  char *local_690;
  char *local_688;
  Triple **local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  Triple *local_658;
  int local_64c;
  char *local_648;
  char *local_640;
  Triple *local_638;
  int local_62c;
  char *local_628;
  char *local_620;
  Triple *local_618;
  int local_60c;
  char *local_608;
  char *local_600;
  Triple *local_5f8;
  int local_5ec;
  char *local_5e8;
  char *local_5e0;
  Triple *local_5d8;
  int local_5cc;
  char *local_5c8;
  char *local_5c0;
  Triple *local_5b8;
  int local_5ac;
  char *local_5a8;
  char *local_5a0;
  Triple *local_598;
  int local_58c;
  char *local_588;
  char *local_580;
  Triple *local_578;
  int local_56c;
  char *local_568;
  char *local_560;
  Triple *local_558;
  int local_54c;
  char *local_548;
  char *local_540;
  Triple *local_538;
  int local_52c;
  char *local_528;
  char *local_520;
  Triple *local_518;
  int local_50c;
  char *local_508;
  char *local_500;
  Triple *local_4f8;
  int local_4ec;
  char *local_4e8;
  char *local_4e0;
  Triple *local_4d8;
  int local_4cc;
  char *local_4c8;
  char *local_4c0;
  Triple *local_4b8;
  int local_4ac;
  char *local_4a8;
  char *local_4a0;
  Triple *local_498;
  int local_48c;
  char *local_488;
  char *local_480;
  Triple *local_478;
  int local_46c;
  char *local_468;
  char *local_460;
  Triple *local_458;
  int local_44c;
  char *local_448;
  char *local_440;
  Triple *local_438;
  int local_42c;
  char *local_428;
  char *local_420;
  Triple *local_418;
  int local_40c;
  char *local_408;
  char *local_400;
  Triple *local_3f8;
  int local_3ec;
  char *local_3e8;
  char *local_3e0;
  Triple *local_3d8;
  int local_3cc;
  char *local_3c8;
  char *local_3c0;
  Triple *local_3b8;
  int local_3ac;
  char *local_3a8;
  char *local_3a0;
  Triple *local_398;
  int local_38c;
  char *local_388;
  char *local_380;
  Triple *local_378;
  int local_36c;
  char *local_368;
  char *local_360;
  Triple *local_358;
  int local_34c;
  char *local_348;
  char *local_340;
  Triple *local_338;
  int local_32c;
  char *local_328;
  char *local_320;
  Triple *local_318;
  int local_30c;
  char *local_308;
  char *local_300;
  Triple *local_2f8;
  int local_2ec;
  char *local_2e8;
  char *local_2e0;
  Triple *local_2d8;
  int local_2cc;
  char *local_2c8;
  char *local_2c0;
  Triple *local_2b8;
  int local_2ac;
  char *local_2a8;
  char *local_2a0;
  Triple *local_298;
  int local_28c;
  char *local_288;
  char *local_280;
  Triple *local_278;
  int local_26c;
  char *local_268;
  char *local_260;
  Triple *local_258;
  int local_24c;
  char *local_248;
  char *local_240;
  Triple *local_238;
  int local_22c;
  char *local_228;
  char *local_220;
  Triple *local_218;
  int local_20c;
  char *local_208;
  char *local_200;
  Triple *local_1f8;
  int local_1ec;
  char *local_1e8;
  char *local_1e0;
  Triple *local_1d8;
  int local_1cc;
  char *local_1c8;
  char *local_1c0;
  Triple *local_1b8;
  int local_1ac;
  char *local_1a8;
  char *local_1a0;
  Triple *local_198;
  int local_18c;
  char *local_188;
  char *local_180;
  Triple *local_178;
  int local_16c;
  char *local_168;
  char *local_160;
  Triple *local_158;
  int local_14c;
  char *local_148;
  char *local_140;
  Triple *local_138;
  int local_12c;
  char *local_128;
  char *local_120;
  Triple *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  Triple *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  Triple *local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  Triple *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  Triple *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  Triple *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  Triple *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  Triple *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  Triple *local_18;
  int local_c;
  
  local_2190 = Name.Data;
  ArchName.Length = (size_t)local_2190;
  ArchName.Data = (char *)this;
  local_2198 = this;
  pTStack_2180 = this;
  Name_local.Data = local_2190;
  local_2184 = parseBPFArch(ArchName);
  local_21c0 = pTStack_2180;
  local_21b8 = Name_local.Data;
  Name_local.Length = (size_t)&local_21b0;
  local_21b0 = pTStack_2180;
  local_21a8 = Name_local.Data;
  Optional<llvm::Triple::ArchType>::Optional(&OStack_21a0);
  StringLiteral::StringLiteral<8UL>(&local_21d0,(char (*) [8])"aarch64");
  local_14e8 = local_21d0.super_StringRef.Data;
  local_14e0 = (char *)local_21d0.super_StringRef.Length;
  local_14f4 = aarch64;
  local_14f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1508 = local_21b0;
    local_1500 = local_21a8;
    local_1518 = local_14e8;
    local_1510 = local_14e0;
    local_1468 = local_14e8;
    local_1460 = local_14e0;
    local_1478 = local_14e8;
    local_1470 = local_14e0;
    local_678 = local_14e8;
    local_670 = local_14e0;
    local_680 = &local_1458;
    bVar1 = false;
    local_1458 = local_1508;
    local_1450 = local_1500;
    if (local_21a8 == local_14e0) {
      local_658 = local_21b0;
      local_660 = local_14e8;
      local_668 = local_14e0;
      if (local_14e0 == (char *)0x0) {
        local_64c = 0;
      }
      else {
        local_64c = memcmp(local_21b0,local_14e8,(size_t)local_14e0);
      }
      bVar1 = local_64c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_14f4);
    }
  }
  StringLiteral::StringLiteral<11UL>(&local_21e0,(char (*) [11])"aarch64_be");
  local_1528 = local_21e0.super_StringRef.Data;
  local_1520 = (char *)local_21e0.super_StringRef.Length;
  local_1534 = aarch64_be;
  local_1530 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1548 = local_21b0;
    local_1540 = local_21a8;
    local_1558 = local_1528;
    local_1550 = local_1520;
    local_1438 = local_1528;
    local_1430 = local_1520;
    local_1448 = local_1528;
    local_1440 = local_1520;
    local_690 = local_1528;
    local_688 = local_1520;
    local_698 = &local_1428;
    bVar1 = false;
    local_1428 = local_1548;
    local_1420 = local_1540;
    if (local_21a8 == local_1520) {
      local_638 = local_21b0;
      local_640 = local_1528;
      local_648 = local_1520;
      if (local_1520 == (char *)0x0) {
        local_62c = 0;
      }
      else {
        local_62c = memcmp(local_21b0,local_1528,(size_t)local_1520);
      }
      bVar1 = local_62c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1534);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_21f0,(char (*) [4])0x33a892);
  local_1568 = local_21f0.super_StringRef.Data;
  local_1560 = (char *)local_21f0.super_StringRef.Length;
  local_1574 = arc;
  local_1570 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1588 = local_21b0;
    local_1580 = local_21a8;
    local_1598 = local_1568;
    local_1590 = local_1560;
    local_1408 = local_1568;
    local_1400 = local_1560;
    local_1418 = local_1568;
    local_1410 = local_1560;
    local_6a8 = local_1568;
    local_6a0 = local_1560;
    local_6b0 = &local_13f8;
    bVar1 = false;
    local_13f8 = local_1588;
    local_13f0 = local_1580;
    if (local_21a8 == local_1560) {
      local_618 = local_21b0;
      local_620 = local_1568;
      local_628 = local_1560;
      if (local_1560 == (char *)0x0) {
        local_60c = 0;
      }
      else {
        local_60c = memcmp(local_21b0,local_1568,(size_t)local_1560);
      }
      bVar1 = local_60c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1574);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_2200,(char (*) [6])"arm64");
  local_15a8 = local_2200.super_StringRef.Data;
  local_15a0 = (char *)local_2200.super_StringRef.Length;
  local_15b4 = aarch64;
  local_15b0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_15c8 = local_21b0;
    local_15c0 = local_21a8;
    local_15d8 = local_15a8;
    local_15d0 = local_15a0;
    local_13d8 = local_15a8;
    local_13d0 = local_15a0;
    local_13e8 = local_15a8;
    local_13e0 = local_15a0;
    local_6c0 = local_15a8;
    local_6b8 = local_15a0;
    local_6c8 = &local_13c8;
    bVar1 = false;
    local_13c8 = local_15c8;
    local_13c0 = local_15c0;
    if (local_21a8 == local_15a0) {
      local_5f8 = local_21b0;
      local_600 = local_15a8;
      local_608 = local_15a0;
      if (local_15a0 == (char *)0x0) {
        local_5ec = 0;
      }
      else {
        local_5ec = memcmp(local_21b0,local_15a8,(size_t)local_15a0);
      }
      bVar1 = local_5ec == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_15b4);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_2210,(char (*) [4])0x33d529);
  local_15e8 = local_2210.super_StringRef.Data;
  local_15e0 = (char *)local_2210.super_StringRef.Length;
  local_15f4 = arm;
  local_15f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1608 = local_21b0;
    local_1600 = local_21a8;
    local_1618 = local_15e8;
    local_1610 = local_15e0;
    local_13a8 = local_15e8;
    local_13a0 = local_15e0;
    local_13b8 = local_15e8;
    local_13b0 = local_15e0;
    local_6d8 = local_15e8;
    local_6d0 = local_15e0;
    local_6e0 = &local_1398;
    bVar1 = false;
    local_1398 = local_1608;
    local_1390 = local_1600;
    if (local_21a8 == local_15e0) {
      local_5d8 = local_21b0;
      local_5e0 = local_15e8;
      local_5e8 = local_15e0;
      if (local_15e0 == (char *)0x0) {
        local_5cc = 0;
      }
      else {
        local_5cc = memcmp(local_21b0,local_15e8,(size_t)local_15e0);
      }
      bVar1 = local_5cc == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_15f4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_2220,(char (*) [6])"armeb");
  local_1628 = local_2220.super_StringRef.Data;
  local_1620 = (char *)local_2220.super_StringRef.Length;
  local_1634 = armeb;
  local_1630 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1648 = local_21b0;
    local_1640 = local_21a8;
    local_1658 = local_1628;
    local_1650 = local_1620;
    local_1378 = local_1628;
    local_1370 = local_1620;
    local_1388 = local_1628;
    local_1380 = local_1620;
    local_6f0 = local_1628;
    local_6e8 = local_1620;
    local_6f8 = &local_1368;
    bVar1 = false;
    local_1368 = local_1648;
    local_1360 = local_1640;
    if (local_21a8 == local_1620) {
      local_5b8 = local_21b0;
      local_5c0 = local_1628;
      local_5c8 = local_1620;
      if (local_1620 == (char *)0x0) {
        local_5ac = 0;
      }
      else {
        local_5ac = memcmp(local_21b0,local_1628,(size_t)local_1620);
      }
      bVar1 = local_5ac == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1634);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_2230,(char (*) [4])"avr");
  local_1668 = local_2230.super_StringRef.Data;
  local_1660 = (char *)local_2230.super_StringRef.Length;
  local_1674 = avr;
  local_1670 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1688 = local_21b0;
    local_1680 = local_21a8;
    local_1698 = local_1668;
    local_1690 = local_1660;
    local_1348 = local_1668;
    local_1340 = local_1660;
    local_1358 = local_1668;
    local_1350 = local_1660;
    local_708 = local_1668;
    local_700 = local_1660;
    local_710 = &local_1338;
    bVar1 = false;
    local_1338 = local_1688;
    local_1330 = local_1680;
    if (local_21a8 == local_1660) {
      local_598 = local_21b0;
      local_5a0 = local_1668;
      local_5a8 = local_1660;
      if (local_1660 == (char *)0x0) {
        local_58c = 0;
      }
      else {
        local_58c = memcmp(local_21b0,local_1668,(size_t)local_1660);
      }
      bVar1 = local_58c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1674);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_2240,(char (*) [4])"bpf");
  local_14b8 = local_2240.super_StringRef.Data;
  local_14b0 = (char *)local_2240.super_StringRef.Length;
  local_14c4 = local_2184;
  local_14c0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_14d8 = local_14b8;
    local_14d0 = local_14b0;
    local_1488 = local_14b8;
    local_1480 = local_14b0;
    bVar1 = false;
    local_1490 = &local_21b0;
    if (local_14b0 <= local_21a8) {
      local_18 = local_21b0;
      local_20 = local_14b8;
      local_28 = local_14b0;
      if (local_14b0 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_21b0,local_14b8,(size_t)local_14b0);
      }
      bVar1 = local_c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_14c4);
    }
  }
  StringLiteral::StringLiteral<5UL>(&local_2250,(char (*) [5])"mips");
  local_16a8 = local_2250.super_StringRef.Data;
  local_16a0 = (char *)local_2250.super_StringRef.Length;
  local_16b4 = mips;
  local_16b0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_16c8 = local_21b0;
    local_16c0 = local_21a8;
    local_16d8 = local_16a8;
    local_16d0 = local_16a0;
    local_1318 = local_16a8;
    local_1310 = local_16a0;
    local_1328 = local_16a8;
    local_1320 = local_16a0;
    local_720 = local_16a8;
    local_718 = local_16a0;
    local_728 = &local_1308;
    bVar1 = false;
    local_1308 = local_16c8;
    local_1300 = local_16c0;
    if (local_21a8 == local_16a0) {
      local_578 = local_21b0;
      local_580 = local_16a8;
      local_588 = local_16a0;
      if (local_16a0 == (char *)0x0) {
        local_56c = 0;
      }
      else {
        local_56c = memcmp(local_21b0,local_16a8,(size_t)local_16a0);
      }
      bVar1 = local_56c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_16b4);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_2260,(char (*) [7])"mipsel");
  local_16e8 = local_2260.super_StringRef.Data;
  local_16e0 = (char *)local_2260.super_StringRef.Length;
  local_16f4 = mipsel;
  local_16f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1708 = local_21b0;
    local_1700 = local_21a8;
    local_1718 = local_16e8;
    local_1710 = local_16e0;
    local_12e8 = local_16e8;
    local_12e0 = local_16e0;
    local_12f8 = local_16e8;
    local_12f0 = local_16e0;
    local_738 = local_16e8;
    local_730 = local_16e0;
    local_740 = &local_12d8;
    bVar1 = false;
    local_12d8 = local_1708;
    local_12d0 = local_1700;
    if (local_21a8 == local_16e0) {
      local_558 = local_21b0;
      local_560 = local_16e8;
      local_568 = local_16e0;
      if (local_16e0 == (char *)0x0) {
        local_54c = 0;
      }
      else {
        local_54c = memcmp(local_21b0,local_16e8,(size_t)local_16e0);
      }
      bVar1 = local_54c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_16f4);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_2270,(char (*) [7])"mips64");
  local_1728 = local_2270.super_StringRef.Data;
  local_1720 = (char *)local_2270.super_StringRef.Length;
  local_1734 = mips64;
  local_1730 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1748 = local_21b0;
    local_1740 = local_21a8;
    local_1758 = local_1728;
    local_1750 = local_1720;
    local_12b8 = local_1728;
    local_12b0 = local_1720;
    local_12c8 = local_1728;
    local_12c0 = local_1720;
    local_750 = local_1728;
    local_748 = local_1720;
    local_758 = &local_12a8;
    bVar1 = false;
    local_12a8 = local_1748;
    local_12a0 = local_1740;
    if (local_21a8 == local_1720) {
      local_538 = local_21b0;
      local_540 = local_1728;
      local_548 = local_1720;
      if (local_1720 == (char *)0x0) {
        local_52c = 0;
      }
      else {
        local_52c = memcmp(local_21b0,local_1728,(size_t)local_1720);
      }
      bVar1 = local_52c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1734);
    }
  }
  StringLiteral::StringLiteral<9UL>(&local_2280,(char (*) [9])"mips64el");
  local_1768 = local_2280.super_StringRef.Data;
  local_1760 = (char *)local_2280.super_StringRef.Length;
  local_1774 = mips64el;
  local_1770 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1788 = local_21b0;
    local_1780 = local_21a8;
    local_1798 = local_1768;
    local_1790 = local_1760;
    local_1288 = local_1768;
    local_1280 = local_1760;
    local_1298 = local_1768;
    local_1290 = local_1760;
    local_768 = local_1768;
    local_760 = local_1760;
    local_770 = &local_1278;
    bVar1 = false;
    local_1278 = local_1788;
    local_1270 = local_1780;
    if (local_21a8 == local_1760) {
      local_518 = local_21b0;
      local_520 = local_1768;
      local_528 = local_1760;
      if (local_1760 == (char *)0x0) {
        local_50c = 0;
      }
      else {
        local_50c = memcmp(local_21b0,local_1768,(size_t)local_1760);
      }
      bVar1 = local_50c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1774);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_2290,(char (*) [7])"msp430");
  local_17a8 = local_2290.super_StringRef.Data;
  local_17a0 = (char *)local_2290.super_StringRef.Length;
  local_17b4 = msp430;
  local_17b0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_17c8 = local_21b0;
    local_17c0 = local_21a8;
    local_17d8 = local_17a8;
    local_17d0 = local_17a0;
    local_1258 = local_17a8;
    local_1250 = local_17a0;
    local_1268 = local_17a8;
    local_1260 = local_17a0;
    local_780 = local_17a8;
    local_778 = local_17a0;
    local_788 = &local_1248;
    bVar1 = false;
    local_1248 = local_17c8;
    local_1240 = local_17c0;
    if (local_21a8 == local_17a0) {
      local_4f8 = local_21b0;
      local_500 = local_17a8;
      local_508 = local_17a0;
      if (local_17a0 == (char *)0x0) {
        local_4ec = 0;
      }
      else {
        local_4ec = memcmp(local_21b0,local_17a8,(size_t)local_17a0);
      }
      bVar1 = local_4ec == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_17b4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_22a0,(char (*) [6])"nios2");
  local_17e8 = local_22a0.super_StringRef.Data;
  local_17e0 = (char *)local_22a0.super_StringRef.Length;
  local_17f4 = nios2;
  local_17f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1808 = local_21b0;
    local_1800 = local_21a8;
    local_1818 = local_17e8;
    local_1810 = local_17e0;
    local_1228 = local_17e8;
    local_1220 = local_17e0;
    local_1238 = local_17e8;
    local_1230 = local_17e0;
    local_798 = local_17e8;
    local_790 = local_17e0;
    local_7a0 = &local_1218;
    bVar1 = false;
    local_1218 = local_1808;
    local_1210 = local_1800;
    if (local_21a8 == local_17e0) {
      local_4d8 = local_21b0;
      local_4e0 = local_17e8;
      local_4e8 = local_17e0;
      if (local_17e0 == (char *)0x0) {
        local_4cc = 0;
      }
      else {
        local_4cc = memcmp(local_21b0,local_17e8,(size_t)local_17e0);
      }
      bVar1 = local_4cc == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_17f4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_22b0,(char (*) [6])"ppc64");
  local_1828 = local_22b0.super_StringRef.Data;
  local_1820 = (char *)local_22b0.super_StringRef.Length;
  local_1834 = ppc64;
  local_1830 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1848 = local_21b0;
    local_1840 = local_21a8;
    local_1858 = local_1828;
    local_1850 = local_1820;
    local_11f8 = local_1828;
    local_11f0 = local_1820;
    local_1208 = local_1828;
    local_1200 = local_1820;
    local_7b0 = local_1828;
    local_7a8 = local_1820;
    local_7b8 = &local_11e8;
    bVar1 = false;
    local_11e8 = local_1848;
    local_11e0 = local_1840;
    if (local_21a8 == local_1820) {
      local_4b8 = local_21b0;
      local_4c0 = local_1828;
      local_4c8 = local_1820;
      if (local_1820 == (char *)0x0) {
        local_4ac = 0;
      }
      else {
        local_4ac = memcmp(local_21b0,local_1828,(size_t)local_1820);
      }
      bVar1 = local_4ac == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1834);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_22c0,(char (*) [6])"ppc32");
  local_1868 = local_22c0.super_StringRef.Data;
  local_1860 = (char *)local_22c0.super_StringRef.Length;
  local_1874 = ppc;
  local_1870 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1888 = local_21b0;
    local_1880 = local_21a8;
    local_1898 = local_1868;
    local_1890 = local_1860;
    local_11c8 = local_1868;
    local_11c0 = local_1860;
    local_11d8 = local_1868;
    local_11d0 = local_1860;
    local_7c8 = local_1868;
    local_7c0 = local_1860;
    local_7d0 = &local_11b8;
    bVar1 = false;
    local_11b8 = local_1888;
    local_11b0 = local_1880;
    if (local_21a8 == local_1860) {
      local_498 = local_21b0;
      local_4a0 = local_1868;
      local_4a8 = local_1860;
      if (local_1860 == (char *)0x0) {
        local_48c = 0;
      }
      else {
        local_48c = memcmp(local_21b0,local_1868,(size_t)local_1860);
      }
      bVar1 = local_48c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1874);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_22d0,(char (*) [4])"ppc");
  local_18a8 = local_22d0.super_StringRef.Data;
  local_18a0 = (char *)local_22d0.super_StringRef.Length;
  local_18b4 = ppc;
  local_18b0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_18c8 = local_21b0;
    local_18c0 = local_21a8;
    local_18d8 = local_18a8;
    local_18d0 = local_18a0;
    local_1198 = local_18a8;
    local_1190 = local_18a0;
    local_11a8 = local_18a8;
    local_11a0 = local_18a0;
    local_7e0 = local_18a8;
    local_7d8 = local_18a0;
    local_7e8 = &local_1188;
    bVar1 = false;
    local_1188 = local_18c8;
    local_1180 = local_18c0;
    if (local_21a8 == local_18a0) {
      local_478 = local_21b0;
      local_480 = local_18a8;
      local_488 = local_18a0;
      if (local_18a0 == (char *)0x0) {
        local_46c = 0;
      }
      else {
        local_46c = memcmp(local_21b0,local_18a8,(size_t)local_18a0);
      }
      bVar1 = local_46c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_18b4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_22e0,(char (*) [8])"ppc64le");
  local_18e8 = local_22e0.super_StringRef.Data;
  local_18e0 = (char *)local_22e0.super_StringRef.Length;
  local_18f4 = ppc64le;
  local_18f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1908 = local_21b0;
    local_1900 = local_21a8;
    local_1918 = local_18e8;
    local_1910 = local_18e0;
    local_1168 = local_18e8;
    local_1160 = local_18e0;
    local_1178 = local_18e8;
    local_1170 = local_18e0;
    local_7f8 = local_18e8;
    local_7f0 = local_18e0;
    local_800 = &local_1158;
    bVar1 = false;
    local_1158 = local_1908;
    local_1150 = local_1900;
    if (local_21a8 == local_18e0) {
      local_458 = local_21b0;
      local_460 = local_18e8;
      local_468 = local_18e0;
      if (local_18e0 == (char *)0x0) {
        local_44c = 0;
      }
      else {
        local_44c = memcmp(local_21b0,local_18e8,(size_t)local_18e0);
      }
      bVar1 = local_44c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_18f4);
    }
  }
  StringLiteral::StringLiteral<5UL>(&local_22f0,(char (*) [5])"r600");
  local_1928 = local_22f0.super_StringRef.Data;
  local_1920 = (char *)local_22f0.super_StringRef.Length;
  local_1934 = r600;
  local_1930 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1948 = local_21b0;
    local_1940 = local_21a8;
    local_1958 = local_1928;
    local_1950 = local_1920;
    local_1138 = local_1928;
    local_1130 = local_1920;
    local_1148 = local_1928;
    local_1140 = local_1920;
    local_810 = local_1928;
    local_808 = local_1920;
    local_818 = &local_1128;
    bVar1 = false;
    local_1128 = local_1948;
    local_1120 = local_1940;
    if (local_21a8 == local_1920) {
      local_438 = local_21b0;
      local_440 = local_1928;
      local_448 = local_1920;
      if (local_1920 == (char *)0x0) {
        local_42c = 0;
      }
      else {
        local_42c = memcmp(local_21b0,local_1928,(size_t)local_1920);
      }
      bVar1 = local_42c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1934);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_2300,(char (*) [7])"amdgcn");
  local_1968 = local_2300.super_StringRef.Data;
  local_1960 = (char *)local_2300.super_StringRef.Length;
  local_1974 = amdgcn;
  local_1970 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1988 = local_21b0;
    local_1980 = local_21a8;
    local_1998 = local_1968;
    local_1990 = local_1960;
    local_1108 = local_1968;
    local_1100 = local_1960;
    local_1118 = local_1968;
    local_1110 = local_1960;
    local_828 = local_1968;
    local_820 = local_1960;
    local_830 = &local_10f8;
    bVar1 = false;
    local_10f8 = local_1988;
    local_10f0 = local_1980;
    if (local_21a8 == local_1960) {
      local_418 = local_21b0;
      local_420 = local_1968;
      local_428 = local_1960;
      if (local_1960 == (char *)0x0) {
        local_40c = 0;
      }
      else {
        local_40c = memcmp(local_21b0,local_1968,(size_t)local_1960);
      }
      bVar1 = local_40c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1974);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2310,(char (*) [8])"riscv32");
  local_19a8 = local_2310.super_StringRef.Data;
  local_19a0 = (char *)local_2310.super_StringRef.Length;
  local_19b4 = riscv32;
  local_19b0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_19c8 = local_21b0;
    local_19c0 = local_21a8;
    local_19d8 = local_19a8;
    local_19d0 = local_19a0;
    local_10d8 = local_19a8;
    local_10d0 = local_19a0;
    local_10e8 = local_19a8;
    local_10e0 = local_19a0;
    local_840 = local_19a8;
    local_838 = local_19a0;
    local_848 = &local_10c8;
    bVar1 = false;
    local_10c8 = local_19c8;
    local_10c0 = local_19c0;
    if (local_21a8 == local_19a0) {
      local_3f8 = local_21b0;
      local_400 = local_19a8;
      local_408 = local_19a0;
      if (local_19a0 == (char *)0x0) {
        local_3ec = 0;
      }
      else {
        local_3ec = memcmp(local_21b0,local_19a8,(size_t)local_19a0);
      }
      bVar1 = local_3ec == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_19b4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2320,(char (*) [8])"riscv64");
  local_19e8 = local_2320.super_StringRef.Data;
  local_19e0 = (char *)local_2320.super_StringRef.Length;
  local_19f4 = riscv64;
  local_19f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1a08 = local_21b0;
    local_1a00 = local_21a8;
    local_1a18 = local_19e8;
    local_1a10 = local_19e0;
    local_10a8 = local_19e8;
    local_10a0 = local_19e0;
    local_10b8 = local_19e8;
    local_10b0 = local_19e0;
    local_858 = local_19e8;
    local_850 = local_19e0;
    local_860 = &local_1098;
    bVar1 = false;
    local_1098 = local_1a08;
    local_1090 = local_1a00;
    if (local_21a8 == local_19e0) {
      local_3d8 = local_21b0;
      local_3e0 = local_19e8;
      local_3e8 = local_19e0;
      if (local_19e0 == (char *)0x0) {
        local_3cc = 0;
      }
      else {
        local_3cc = memcmp(local_21b0,local_19e8,(size_t)local_19e0);
      }
      bVar1 = local_3cc == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_19f4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2330,(char (*) [8])"hexagon");
  local_1a28 = local_2330.super_StringRef.Data;
  local_1a20 = (char *)local_2330.super_StringRef.Length;
  local_1a34 = hexagon;
  local_1a30 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1a48 = local_21b0;
    local_1a40 = local_21a8;
    local_1a58 = local_1a28;
    local_1a50 = local_1a20;
    local_1078 = local_1a28;
    local_1070 = local_1a20;
    local_1088 = local_1a28;
    local_1080 = local_1a20;
    local_870 = local_1a28;
    local_868 = local_1a20;
    local_878 = &local_1068;
    bVar1 = false;
    local_1068 = local_1a48;
    local_1060 = local_1a40;
    if (local_21a8 == local_1a20) {
      local_3b8 = local_21b0;
      local_3c0 = local_1a28;
      local_3c8 = local_1a20;
      if (local_1a20 == (char *)0x0) {
        local_3ac = 0;
      }
      else {
        local_3ac = memcmp(local_21b0,local_1a28,(size_t)local_1a20);
      }
      bVar1 = local_3ac == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1a34);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_2340,(char (*) [6])"sparc");
  local_1a68 = local_2340.super_StringRef.Data;
  local_1a60 = (char *)local_2340.super_StringRef.Length;
  local_1a74 = sparc;
  local_1a70 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1a88 = local_21b0;
    local_1a80 = local_21a8;
    local_1a98 = local_1a68;
    local_1a90 = local_1a60;
    local_1048 = local_1a68;
    local_1040 = local_1a60;
    local_1058 = local_1a68;
    local_1050 = local_1a60;
    local_888 = local_1a68;
    local_880 = local_1a60;
    local_890 = &local_1038;
    bVar1 = false;
    local_1038 = local_1a88;
    local_1030 = local_1a80;
    if (local_21a8 == local_1a60) {
      local_398 = local_21b0;
      local_3a0 = local_1a68;
      local_3a8 = local_1a60;
      if (local_1a60 == (char *)0x0) {
        local_38c = 0;
      }
      else {
        local_38c = memcmp(local_21b0,local_1a68,(size_t)local_1a60);
      }
      bVar1 = local_38c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1a74);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2350,(char (*) [8])"sparcel");
  local_1aa8 = local_2350.super_StringRef.Data;
  local_1aa0 = (char *)local_2350.super_StringRef.Length;
  local_1ab4 = sparcel;
  local_1ab0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1ac8 = local_21b0;
    local_1ac0 = local_21a8;
    local_1ad8 = local_1aa8;
    local_1ad0 = local_1aa0;
    local_1018 = local_1aa8;
    local_1010 = local_1aa0;
    local_1028 = local_1aa8;
    local_1020 = local_1aa0;
    local_8a0 = local_1aa8;
    local_898 = local_1aa0;
    local_8a8 = &local_1008;
    bVar1 = false;
    local_1008 = local_1ac8;
    local_1000 = local_1ac0;
    if (local_21a8 == local_1aa0) {
      local_378 = local_21b0;
      local_380 = local_1aa8;
      local_388 = local_1aa0;
      if (local_1aa0 == (char *)0x0) {
        local_36c = 0;
      }
      else {
        local_36c = memcmp(local_21b0,local_1aa8,(size_t)local_1aa0);
      }
      bVar1 = local_36c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1ab4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2360,(char (*) [8])"sparcv9");
  local_1ae8 = local_2360.super_StringRef.Data;
  local_1ae0 = (char *)local_2360.super_StringRef.Length;
  local_1af4 = sparcv9;
  local_1af0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1b08 = local_21b0;
    local_1b00 = local_21a8;
    local_1b18 = local_1ae8;
    local_1b10 = local_1ae0;
    local_fe8 = local_1ae8;
    local_fe0 = local_1ae0;
    local_ff8 = local_1ae8;
    local_ff0 = local_1ae0;
    local_8b8 = local_1ae8;
    local_8b0 = local_1ae0;
    local_8c0 = &local_fd8;
    bVar1 = false;
    local_fd8 = local_1b08;
    local_fd0 = local_1b00;
    if (local_21a8 == local_1ae0) {
      local_358 = local_21b0;
      local_360 = local_1ae8;
      local_368 = local_1ae0;
      if (local_1ae0 == (char *)0x0) {
        local_34c = 0;
      }
      else {
        local_34c = memcmp(local_21b0,local_1ae8,(size_t)local_1ae0);
      }
      bVar1 = local_34c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1af4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2370,(char (*) [8])"systemz");
  local_1b28 = local_2370.super_StringRef.Data;
  local_1b20 = (char *)local_2370.super_StringRef.Length;
  local_1b34 = systemz;
  local_1b30 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1b48 = local_21b0;
    local_1b40 = local_21a8;
    local_1b58 = local_1b28;
    local_1b50 = local_1b20;
    local_fb8 = local_1b28;
    local_fb0 = local_1b20;
    local_fc8 = local_1b28;
    local_fc0 = local_1b20;
    local_8d0 = local_1b28;
    local_8c8 = local_1b20;
    local_8d8 = &local_fa8;
    bVar1 = false;
    local_fa8 = local_1b48;
    local_fa0 = local_1b40;
    if (local_21a8 == local_1b20) {
      local_338 = local_21b0;
      local_340 = local_1b28;
      local_348 = local_1b20;
      if (local_1b20 == (char *)0x0) {
        local_32c = 0;
      }
      else {
        local_32c = memcmp(local_21b0,local_1b28,(size_t)local_1b20);
      }
      bVar1 = local_32c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1b34);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_2380,(char (*) [4])"tce");
  local_1b68 = local_2380.super_StringRef.Data;
  local_1b60 = (char *)local_2380.super_StringRef.Length;
  local_1b74 = tce;
  local_1b70 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1b88 = local_21b0;
    local_1b80 = local_21a8;
    local_1b98 = local_1b68;
    local_1b90 = local_1b60;
    local_f88 = local_1b68;
    local_f80 = local_1b60;
    local_f98 = local_1b68;
    local_f90 = local_1b60;
    local_8e8 = local_1b68;
    local_8e0 = local_1b60;
    local_8f0 = &local_f78;
    bVar1 = false;
    local_f78 = local_1b88;
    local_f70 = local_1b80;
    if (local_21a8 == local_1b60) {
      local_318 = local_21b0;
      local_320 = local_1b68;
      local_328 = local_1b60;
      if (local_1b60 == (char *)0x0) {
        local_30c = 0;
      }
      else {
        local_30c = memcmp(local_21b0,local_1b68,(size_t)local_1b60);
      }
      bVar1 = local_30c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1b74);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_2390,(char (*) [6])"tcele");
  local_1ba8 = local_2390.super_StringRef.Data;
  local_1ba0 = (char *)local_2390.super_StringRef.Length;
  local_1bb4 = tcele;
  local_1bb0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1bc8 = local_21b0;
    local_1bc0 = local_21a8;
    local_1bd8 = local_1ba8;
    local_1bd0 = local_1ba0;
    local_f58 = local_1ba8;
    local_f50 = local_1ba0;
    local_f68 = local_1ba8;
    local_f60 = local_1ba0;
    local_900 = local_1ba8;
    local_8f8 = local_1ba0;
    local_908 = &local_f48;
    bVar1 = false;
    local_f48 = local_1bc8;
    local_f40 = local_1bc0;
    if (local_21a8 == local_1ba0) {
      local_2f8 = local_21b0;
      local_300 = local_1ba8;
      local_308 = local_1ba0;
      if (local_1ba0 == (char *)0x0) {
        local_2ec = 0;
      }
      else {
        local_2ec = memcmp(local_21b0,local_1ba8,(size_t)local_1ba0);
      }
      bVar1 = local_2ec == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1bb4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_23a0,(char (*) [6])0x33d4ed);
  local_1be8 = local_23a0.super_StringRef.Data;
  local_1be0 = (char *)local_23a0.super_StringRef.Length;
  local_1bf4 = thumb;
  local_1bf0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1c08 = local_21b0;
    local_1c00 = local_21a8;
    local_1c18 = local_1be8;
    local_1c10 = local_1be0;
    local_f28 = local_1be8;
    local_f20 = local_1be0;
    local_f38 = local_1be8;
    local_f30 = local_1be0;
    local_918 = local_1be8;
    local_910 = local_1be0;
    local_920 = &local_f18;
    bVar1 = false;
    local_f18 = local_1c08;
    local_f10 = local_1c00;
    if (local_21a8 == local_1be0) {
      local_2d8 = local_21b0;
      local_2e0 = local_1be8;
      local_2e8 = local_1be0;
      if (local_1be0 == (char *)0x0) {
        local_2cc = 0;
      }
      else {
        local_2cc = memcmp(local_21b0,local_1be8,(size_t)local_1be0);
      }
      bVar1 = local_2cc == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1bf4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_23b0,(char (*) [8])"thumbeb");
  local_1c28 = local_23b0.super_StringRef.Data;
  local_1c20 = (char *)local_23b0.super_StringRef.Length;
  local_1c34 = thumbeb;
  local_1c30 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1c48 = local_21b0;
    local_1c40 = local_21a8;
    local_1c58 = local_1c28;
    local_1c50 = local_1c20;
    local_ef8 = local_1c28;
    local_ef0 = local_1c20;
    local_f08 = local_1c28;
    local_f00 = local_1c20;
    local_930 = local_1c28;
    local_928 = local_1c20;
    local_938 = &local_ee8;
    bVar1 = false;
    local_ee8 = local_1c48;
    local_ee0 = local_1c40;
    if (local_21a8 == local_1c20) {
      local_2b8 = local_21b0;
      local_2c0 = local_1c28;
      local_2c8 = local_1c20;
      if (local_1c20 == (char *)0x0) {
        local_2ac = 0;
      }
      else {
        local_2ac = memcmp(local_21b0,local_1c28,(size_t)local_1c20);
      }
      bVar1 = local_2ac == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1c34);
    }
  }
  StringLiteral::StringLiteral<4UL>(&local_23c0,(char (*) [4])"x86");
  local_1c68 = local_23c0.super_StringRef.Data;
  local_1c60 = (char *)local_23c0.super_StringRef.Length;
  local_1c74 = x86;
  local_1c70 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1c88 = local_21b0;
    local_1c80 = local_21a8;
    local_1c98 = local_1c68;
    local_1c90 = local_1c60;
    local_ec8 = local_1c68;
    local_ec0 = local_1c60;
    local_ed8 = local_1c68;
    local_ed0 = local_1c60;
    local_948 = local_1c68;
    local_940 = local_1c60;
    local_950 = &local_eb8;
    bVar1 = false;
    local_eb8 = local_1c88;
    local_eb0 = local_1c80;
    if (local_21a8 == local_1c60) {
      local_298 = local_21b0;
      local_2a0 = local_1c68;
      local_2a8 = local_1c60;
      if (local_1c60 == (char *)0x0) {
        local_28c = 0;
      }
      else {
        local_28c = memcmp(local_21b0,local_1c68,(size_t)local_1c60);
      }
      bVar1 = local_28c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1c74);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_23d0,(char (*) [7])"x86-64");
  local_1ca8 = local_23d0.super_StringRef.Data;
  local_1ca0 = (char *)local_23d0.super_StringRef.Length;
  local_1cb4 = x86_64;
  local_1cb0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1cc8 = local_21b0;
    local_1cc0 = local_21a8;
    local_1cd8 = local_1ca8;
    local_1cd0 = local_1ca0;
    local_e98 = local_1ca8;
    local_e90 = local_1ca0;
    local_ea8 = local_1ca8;
    local_ea0 = local_1ca0;
    local_960 = local_1ca8;
    local_958 = local_1ca0;
    local_968 = &local_e88;
    bVar1 = false;
    local_e88 = local_1cc8;
    local_e80 = local_1cc0;
    if (local_21a8 == local_1ca0) {
      local_278 = local_21b0;
      local_280 = local_1ca8;
      local_288 = local_1ca0;
      if (local_1ca0 == (char *)0x0) {
        local_26c = 0;
      }
      else {
        local_26c = memcmp(local_21b0,local_1ca8,(size_t)local_1ca0);
      }
      bVar1 = local_26c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1cb4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_23e0,(char (*) [6])"xcore");
  local_1ce8 = local_23e0.super_StringRef.Data;
  local_1ce0 = (char *)local_23e0.super_StringRef.Length;
  local_1cf4 = xcore;
  local_1cf0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1d08 = local_21b0;
    local_1d00 = local_21a8;
    local_1d18 = local_1ce8;
    local_1d10 = local_1ce0;
    local_e68 = local_1ce8;
    local_e60 = local_1ce0;
    local_e78 = local_1ce8;
    local_e70 = local_1ce0;
    local_978 = local_1ce8;
    local_970 = local_1ce0;
    local_980 = &local_e58;
    bVar1 = false;
    local_e58 = local_1d08;
    local_e50 = local_1d00;
    if (local_21a8 == local_1ce0) {
      local_258 = local_21b0;
      local_260 = local_1ce8;
      local_268 = local_1ce0;
      if (local_1ce0 == (char *)0x0) {
        local_24c = 0;
      }
      else {
        local_24c = memcmp(local_21b0,local_1ce8,(size_t)local_1ce0);
      }
      bVar1 = local_24c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1cf4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_23f0,(char (*) [6])"nvptx");
  local_1d28 = local_23f0.super_StringRef.Data;
  local_1d20 = (char *)local_23f0.super_StringRef.Length;
  local_1d34 = nvptx;
  local_1d30 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1d48 = local_21b0;
    local_1d40 = local_21a8;
    local_1d58 = local_1d28;
    local_1d50 = local_1d20;
    local_e38 = local_1d28;
    local_e30 = local_1d20;
    local_e48 = local_1d28;
    local_e40 = local_1d20;
    local_990 = local_1d28;
    local_988 = local_1d20;
    local_998 = &local_e28;
    bVar1 = false;
    local_e28 = local_1d48;
    local_e20 = local_1d40;
    if (local_21a8 == local_1d20) {
      local_238 = local_21b0;
      local_240 = local_1d28;
      local_248 = local_1d20;
      if (local_1d20 == (char *)0x0) {
        local_22c = 0;
      }
      else {
        local_22c = memcmp(local_21b0,local_1d28,(size_t)local_1d20);
      }
      bVar1 = local_22c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1d34);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2400,(char (*) [8])"nvptx64");
  local_1d68 = local_2400.super_StringRef.Data;
  local_1d60 = (char *)local_2400.super_StringRef.Length;
  local_1d74 = nvptx64;
  local_1d70 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1d88 = local_21b0;
    local_1d80 = local_21a8;
    local_1d98 = local_1d68;
    local_1d90 = local_1d60;
    local_e08 = local_1d68;
    local_e00 = local_1d60;
    local_e18 = local_1d68;
    local_e10 = local_1d60;
    local_9a8 = local_1d68;
    local_9a0 = local_1d60;
    local_9b0 = &local_df8;
    bVar1 = false;
    local_df8 = local_1d88;
    local_df0 = local_1d80;
    if (local_21a8 == local_1d60) {
      local_218 = local_21b0;
      local_220 = local_1d68;
      local_228 = local_1d60;
      if (local_1d60 == (char *)0x0) {
        local_20c = 0;
      }
      else {
        local_20c = memcmp(local_21b0,local_1d68,(size_t)local_1d60);
      }
      bVar1 = local_20c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1d74);
    }
  }
  StringLiteral::StringLiteral<5UL>(&local_2410,(char (*) [5])"le32");
  local_1da8 = local_2410.super_StringRef.Data;
  local_1da0 = (char *)local_2410.super_StringRef.Length;
  local_1db4 = le32;
  local_1db0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1dc8 = local_21b0;
    local_1dc0 = local_21a8;
    local_1dd8 = local_1da8;
    local_1dd0 = local_1da0;
    local_dd8 = local_1da8;
    local_dd0 = local_1da0;
    local_de8 = local_1da8;
    local_de0 = local_1da0;
    local_9c0 = local_1da8;
    local_9b8 = local_1da0;
    local_9c8 = &local_dc8;
    bVar1 = false;
    local_dc8 = local_1dc8;
    local_dc0 = local_1dc0;
    if (local_21a8 == local_1da0) {
      local_1f8 = local_21b0;
      local_200 = local_1da8;
      local_208 = local_1da0;
      if (local_1da0 == (char *)0x0) {
        local_1ec = 0;
      }
      else {
        local_1ec = memcmp(local_21b0,local_1da8,(size_t)local_1da0);
      }
      bVar1 = local_1ec == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1db4);
    }
  }
  StringLiteral::StringLiteral<5UL>(&local_2420,(char (*) [5])"le64");
  local_1de8 = local_2420.super_StringRef.Data;
  local_1de0 = (char *)local_2420.super_StringRef.Length;
  local_1df4 = le64;
  local_1df0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1e08 = local_21b0;
    local_1e00 = local_21a8;
    local_1e18 = local_1de8;
    local_1e10 = local_1de0;
    local_da8 = local_1de8;
    local_da0 = local_1de0;
    local_db8 = local_1de8;
    local_db0 = local_1de0;
    local_9d8 = local_1de8;
    local_9d0 = local_1de0;
    local_9e0 = &local_d98;
    bVar1 = false;
    local_d98 = local_1e08;
    local_d90 = local_1e00;
    if (local_21a8 == local_1de0) {
      local_1d8 = local_21b0;
      local_1e0 = local_1de8;
      local_1e8 = local_1de0;
      if (local_1de0 == (char *)0x0) {
        local_1cc = 0;
      }
      else {
        local_1cc = memcmp(local_21b0,local_1de8,(size_t)local_1de0);
      }
      bVar1 = local_1cc == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1df4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_2430,(char (*) [6])"amdil");
  local_1e28 = local_2430.super_StringRef.Data;
  local_1e20 = (char *)local_2430.super_StringRef.Length;
  local_1e34 = amdil;
  local_1e30 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1e48 = local_21b0;
    local_1e40 = local_21a8;
    local_1e58 = local_1e28;
    local_1e50 = local_1e20;
    local_d78 = local_1e28;
    local_d70 = local_1e20;
    local_d88 = local_1e28;
    local_d80 = local_1e20;
    local_9f0 = local_1e28;
    local_9e8 = local_1e20;
    local_9f8 = &local_d68;
    bVar1 = false;
    local_d68 = local_1e48;
    local_d60 = local_1e40;
    if (local_21a8 == local_1e20) {
      local_1b8 = local_21b0;
      local_1c0 = local_1e28;
      local_1c8 = local_1e20;
      if (local_1e20 == (char *)0x0) {
        local_1ac = 0;
      }
      else {
        local_1ac = memcmp(local_21b0,local_1e28,(size_t)local_1e20);
      }
      bVar1 = local_1ac == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1e34);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2440,(char (*) [8])"amdil64");
  local_1e68 = local_2440.super_StringRef.Data;
  local_1e60 = (char *)local_2440.super_StringRef.Length;
  local_1e74 = amdil64;
  local_1e70 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1e88 = local_21b0;
    local_1e80 = local_21a8;
    local_1e98 = local_1e68;
    local_1e90 = local_1e60;
    local_d48 = local_1e68;
    local_d40 = local_1e60;
    local_d58 = local_1e68;
    local_d50 = local_1e60;
    local_a08 = local_1e68;
    local_a00 = local_1e60;
    local_a10 = &local_d38;
    bVar1 = false;
    local_d38 = local_1e88;
    local_d30 = local_1e80;
    if (local_21a8 == local_1e60) {
      local_198 = local_21b0;
      local_1a0 = local_1e68;
      local_1a8 = local_1e60;
      if (local_1e60 == (char *)0x0) {
        local_18c = 0;
      }
      else {
        local_18c = memcmp(local_21b0,local_1e68,(size_t)local_1e60);
      }
      bVar1 = local_18c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1e74);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_2450,(char (*) [6])"hsail");
  local_1ea8 = local_2450.super_StringRef.Data;
  local_1ea0 = (char *)local_2450.super_StringRef.Length;
  local_1eb4 = hsail;
  local_1eb0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1ec8 = local_21b0;
    local_1ec0 = local_21a8;
    local_1ed8 = local_1ea8;
    local_1ed0 = local_1ea0;
    local_d18 = local_1ea8;
    local_d10 = local_1ea0;
    local_d28 = local_1ea8;
    local_d20 = local_1ea0;
    local_a20 = local_1ea8;
    local_a18 = local_1ea0;
    local_a28 = &local_d08;
    bVar1 = false;
    local_d08 = local_1ec8;
    local_d00 = local_1ec0;
    if (local_21a8 == local_1ea0) {
      local_178 = local_21b0;
      local_180 = local_1ea8;
      local_188 = local_1ea0;
      if (local_1ea0 == (char *)0x0) {
        local_16c = 0;
      }
      else {
        local_16c = memcmp(local_21b0,local_1ea8,(size_t)local_1ea0);
      }
      bVar1 = local_16c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1eb4);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2460,(char (*) [8])"hsail64");
  local_1ee8 = local_2460.super_StringRef.Data;
  local_1ee0 = (char *)local_2460.super_StringRef.Length;
  local_1ef4 = hsail64;
  local_1ef0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1f08 = local_21b0;
    local_1f00 = local_21a8;
    local_1f18 = local_1ee8;
    local_1f10 = local_1ee0;
    local_ce8 = local_1ee8;
    local_ce0 = local_1ee0;
    local_cf8 = local_1ee8;
    local_cf0 = local_1ee0;
    local_a38 = local_1ee8;
    local_a30 = local_1ee0;
    local_a40 = &local_cd8;
    bVar1 = false;
    local_cd8 = local_1f08;
    local_cd0 = local_1f00;
    if (local_21a8 == local_1ee0) {
      local_158 = local_21b0;
      local_160 = local_1ee8;
      local_168 = local_1ee0;
      if (local_1ee0 == (char *)0x0) {
        local_14c = 0;
      }
      else {
        local_14c = memcmp(local_21b0,local_1ee8,(size_t)local_1ee0);
      }
      bVar1 = local_14c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1ef4);
    }
  }
  StringLiteral::StringLiteral<5UL>(&local_2470,(char (*) [5])"spir");
  local_1f28 = local_2470.super_StringRef.Data;
  local_1f20 = (char *)local_2470.super_StringRef.Length;
  local_1f34 = spir;
  local_1f30 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1f48 = local_21b0;
    local_1f40 = local_21a8;
    local_1f58 = local_1f28;
    local_1f50 = local_1f20;
    local_cb8 = local_1f28;
    local_cb0 = local_1f20;
    local_cc8 = local_1f28;
    local_cc0 = local_1f20;
    local_a50 = local_1f28;
    local_a48 = local_1f20;
    local_a58 = &local_ca8;
    bVar1 = false;
    local_ca8 = local_1f48;
    local_ca0 = local_1f40;
    if (local_21a8 == local_1f20) {
      local_138 = local_21b0;
      local_140 = local_1f28;
      local_148 = local_1f20;
      if (local_1f20 == (char *)0x0) {
        local_12c = 0;
      }
      else {
        local_12c = memcmp(local_21b0,local_1f28,(size_t)local_1f20);
      }
      bVar1 = local_12c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1f34);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_2480,(char (*) [7])"spir64");
  local_1f68 = local_2480.super_StringRef.Data;
  local_1f60 = (char *)local_2480.super_StringRef.Length;
  local_1f74 = spir64;
  local_1f70 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1f88 = local_21b0;
    local_1f80 = local_21a8;
    local_1f98 = local_1f68;
    local_1f90 = local_1f60;
    local_c88 = local_1f68;
    local_c80 = local_1f60;
    local_c98 = local_1f68;
    local_c90 = local_1f60;
    local_a68 = local_1f68;
    local_a60 = local_1f60;
    local_a70 = &local_c78;
    bVar1 = false;
    local_c78 = local_1f88;
    local_c70 = local_1f80;
    if (local_21a8 == local_1f60) {
      local_118 = local_21b0;
      local_120 = local_1f68;
      local_128 = local_1f60;
      if (local_1f60 == (char *)0x0) {
        local_10c = 0;
      }
      else {
        local_10c = memcmp(local_21b0,local_1f68,(size_t)local_1f60);
      }
      bVar1 = local_10c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1f74);
    }
  }
  StringLiteral::StringLiteral<8UL>(&local_2490,(char (*) [8])"kalimba");
  local_1fa8 = local_2490.super_StringRef.Data;
  local_1fa0 = (char *)local_2490.super_StringRef.Length;
  local_1fb4 = kalimba;
  local_1fb0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_1fc8 = local_21b0;
    local_1fc0 = local_21a8;
    local_1fd8 = local_1fa8;
    local_1fd0 = local_1fa0;
    local_c58 = local_1fa8;
    local_c50 = local_1fa0;
    local_c68 = local_1fa8;
    local_c60 = local_1fa0;
    local_a80 = local_1fa8;
    local_a78 = local_1fa0;
    local_a88 = &local_c48;
    bVar1 = false;
    local_c48 = local_1fc8;
    local_c40 = local_1fc0;
    if (local_21a8 == local_1fa0) {
      local_f8 = local_21b0;
      local_100 = local_1fa8;
      local_108 = local_1fa0;
      if (local_1fa0 == (char *)0x0) {
        local_ec = 0;
      }
      else {
        local_ec = memcmp(local_21b0,local_1fa8,(size_t)local_1fa0);
      }
      bVar1 = local_ec == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1fb4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_24a0,(char (*) [6])"lanai");
  local_1fe8 = local_24a0.super_StringRef.Data;
  local_1fe0 = (char *)local_24a0.super_StringRef.Length;
  local_1ff4 = lanai;
  local_1ff0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_2008 = local_21b0;
    local_2000 = local_21a8;
    local_2018 = local_1fe8;
    local_2010 = local_1fe0;
    local_c28 = local_1fe8;
    local_c20 = local_1fe0;
    local_c38 = local_1fe8;
    local_c30 = local_1fe0;
    local_a98 = local_1fe8;
    local_a90 = local_1fe0;
    local_aa0 = &local_c18;
    bVar1 = false;
    local_c18 = local_2008;
    local_c10 = local_2000;
    if (local_21a8 == local_1fe0) {
      local_d8 = local_21b0;
      local_e0 = local_1fe8;
      local_e8 = local_1fe0;
      if (local_1fe0 == (char *)0x0) {
        local_cc = 0;
      }
      else {
        local_cc = memcmp(local_21b0,local_1fe8,(size_t)local_1fe0);
      }
      bVar1 = local_cc == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_1ff4);
    }
  }
  StringLiteral::StringLiteral<6UL>(&local_24b0,(char (*) [6])"shave");
  local_2028 = local_24b0.super_StringRef.Data;
  local_2020 = (char *)local_24b0.super_StringRef.Length;
  local_2034 = shave;
  local_2030 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_2048 = local_21b0;
    local_2040 = local_21a8;
    local_2058 = local_2028;
    local_2050 = local_2020;
    local_bf8 = local_2028;
    local_bf0 = local_2020;
    local_c08 = local_2028;
    local_c00 = local_2020;
    local_ab0 = local_2028;
    local_aa8 = local_2020;
    local_ab8 = &local_be8;
    bVar1 = false;
    local_be8 = local_2048;
    local_be0 = local_2040;
    if (local_21a8 == local_2020) {
      local_b8 = local_21b0;
      local_c0 = local_2028;
      local_c8 = local_2020;
      if (local_2020 == (char *)0x0) {
        local_ac = 0;
      }
      else {
        local_ac = memcmp(local_21b0,local_2028,(size_t)local_2020);
      }
      bVar1 = local_ac == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_2034);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_24c0,(char (*) [7])"wasm32");
  local_2068 = local_24c0.super_StringRef.Data;
  local_2060 = (char *)local_24c0.super_StringRef.Length;
  local_2074 = wasm32;
  local_2070 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_2088 = local_21b0;
    local_2080 = local_21a8;
    local_2098 = local_2068;
    local_2090 = local_2060;
    local_bc8 = local_2068;
    local_bc0 = local_2060;
    local_bd8 = local_2068;
    local_bd0 = local_2060;
    local_ac8 = local_2068;
    local_ac0 = local_2060;
    local_ad0 = &local_bb8;
    bVar1 = false;
    local_bb8 = local_2088;
    local_bb0 = local_2080;
    if (local_21a8 == local_2060) {
      local_98 = local_21b0;
      local_a0 = local_2068;
      local_a8 = local_2060;
      if (local_2060 == (char *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = memcmp(local_21b0,local_2068,(size_t)local_2060);
      }
      bVar1 = local_8c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_2074);
    }
  }
  StringLiteral::StringLiteral<7UL>(&local_24d0,(char (*) [7])"wasm64");
  local_20a8 = local_24d0.super_StringRef.Data;
  local_20a0 = (char *)local_24d0.super_StringRef.Length;
  local_20b4 = wasm64;
  local_20b0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_20c8 = local_21b0;
    local_20c0 = local_21a8;
    local_20d8 = local_20a8;
    local_20d0 = local_20a0;
    local_b98 = local_20a8;
    local_b90 = local_20a0;
    local_ba8 = local_20a8;
    local_ba0 = local_20a0;
    local_ae0 = local_20a8;
    local_ad8 = local_20a0;
    local_ae8 = &local_b88;
    bVar1 = false;
    local_b88 = local_20c8;
    local_b80 = local_20c0;
    if (local_21a8 == local_20a0) {
      local_78 = local_21b0;
      local_80 = local_20a8;
      local_88 = local_20a0;
      if (local_20a0 == (char *)0x0) {
        local_6c = 0;
      }
      else {
        local_6c = memcmp(local_21b0,local_20a8,(size_t)local_20a0);
      }
      bVar1 = local_6c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_20b4);
    }
  }
  StringLiteral::StringLiteral<15UL>(&local_24e0,(char (*) [15])"renderscript32");
  local_20e8 = local_24e0.super_StringRef.Data;
  local_20e0 = (char *)local_24e0.super_StringRef.Length;
  local_20f4 = renderscript32;
  local_20f0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_2108 = local_21b0;
    local_2100 = local_21a8;
    local_2118 = local_20e8;
    local_2110 = local_20e0;
    local_b68 = local_20e8;
    local_b60 = local_20e0;
    local_b78 = local_20e8;
    local_b70 = local_20e0;
    local_af8 = local_20e8;
    local_af0 = local_20e0;
    local_b00 = &local_b58;
    bVar1 = false;
    local_b58 = local_2108;
    local_b50 = local_2100;
    if (local_21a8 == local_20e0) {
      local_58 = local_21b0;
      local_60 = local_20e8;
      local_68 = local_20e0;
      if (local_20e0 == (char *)0x0) {
        local_4c = 0;
      }
      else {
        local_4c = memcmp(local_21b0,local_20e8,(size_t)local_20e0);
      }
      bVar1 = local_4c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_20f4);
    }
  }
  StringLiteral::StringLiteral<15UL>(&local_24f0,(char (*) [15])"renderscript64");
  local_2128 = local_24f0.super_StringRef.Data;
  local_2120 = (char *)local_24f0.super_StringRef.Length;
  local_2134 = LastArchType;
  local_2130 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (!bVar1) {
    local_b28 = local_21b0;
    local_b20 = local_21a8;
    local_b38 = local_2128;
    local_b30 = local_2120;
    local_b48 = local_2128;
    local_b40 = local_2120;
    local_b10 = local_2128;
    local_b08 = local_2120;
    local_b18 = &local_b28;
    bVar1 = false;
    if (local_21a8 == local_2120) {
      local_38 = local_21b0;
      local_40 = local_2128;
      local_48 = local_2120;
      if (local_2120 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_21b0,local_2128,(size_t)local_2120);
      }
      bVar1 = local_2c == 0;
    }
    if (bVar1) {
      Optional<llvm::Triple::ArchType>::operator=(&OStack_21a0,&local_2134);
    }
  }
  local_14a4 = UnknownArch;
  local_14a0 = &local_21b0;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_21a0);
  if (bVar1) {
    pAVar2 = Optional<llvm::Triple::ArchType>::operator*(&OStack_21a0);
    local_1494 = *pAVar2;
  }
  else {
    local_1494 = local_14a4;
  }
  return local_1494;
}

Assistant:

Triple::ArchType Triple::getArchTypeForLLVMName(StringRef Name) {
  Triple::ArchType BPFArch(parseBPFArch(Name));
  return StringSwitch<Triple::ArchType>(Name)
    .Case("aarch64", aarch64)
    .Case("aarch64_be", aarch64_be)
    .Case("arc", arc)
    .Case("arm64", aarch64) // "arm64" is an alias for "aarch64"
    .Case("arm", arm)
    .Case("armeb", armeb)
    .Case("avr", avr)
    .StartsWith("bpf", BPFArch)
    .Case("mips", mips)
    .Case("mipsel", mipsel)
    .Case("mips64", mips64)
    .Case("mips64el", mips64el)
    .Case("msp430", msp430)
    .Case("nios2", nios2)
    .Case("ppc64", ppc64)
    .Case("ppc32", ppc)
    .Case("ppc", ppc)
    .Case("ppc64le", ppc64le)
    .Case("r600", r600)
    .Case("amdgcn", amdgcn)
    .Case("riscv32", riscv32)
    .Case("riscv64", riscv64)
    .Case("hexagon", hexagon)
    .Case("sparc", sparc)
    .Case("sparcel", sparcel)
    .Case("sparcv9", sparcv9)
    .Case("systemz", systemz)
    .Case("tce", tce)
    .Case("tcele", tcele)
    .Case("thumb", thumb)
    .Case("thumbeb", thumbeb)
    .Case("x86", x86)
    .Case("x86-64", x86_64)
    .Case("xcore", xcore)
    .Case("nvptx", nvptx)
    .Case("nvptx64", nvptx64)
    .Case("le32", le32)
    .Case("le64", le64)
    .Case("amdil", amdil)
    .Case("amdil64", amdil64)
    .Case("hsail", hsail)
    .Case("hsail64", hsail64)
    .Case("spir", spir)
    .Case("spir64", spir64)
    .Case("kalimba", kalimba)
    .Case("lanai", lanai)
    .Case("shave", shave)
    .Case("wasm32", wasm32)
    .Case("wasm64", wasm64)
    .Case("renderscript32", renderscript32)
    .Case("renderscript64", renderscript64)
    .Default(UnknownArch);
}